

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O2

int32_t decodeBocu1TrailByte(int32_t count,int32_t b)

{
  int iVar1;
  
  if (b < 0x21) {
    iVar1 = (int)bocu1ByteToTrail[(uint)b];
  }
  else {
    iVar1 = b + -0xd;
  }
  if (count != 1) {
    if (count == 2) {
      return iVar1 * 0xf3;
    }
    iVar1 = iVar1 * 0xe6a9;
  }
  return iVar1;
}

Assistant:

static inline int32_t
decodeBocu1TrailByte(int32_t count, int32_t b) {
    if(b<=0x20) {
        /* skip some C0 controls and make the trail byte range contiguous */
        b=bocu1ByteToTrail[b];
        /* b<0 for an illegal trail byte value will result in return<0 below */
#if BOCU1_MAX_TRAIL<0xff
    } else if(b>BOCU1_MAX_TRAIL) {
        return -99;
#endif
    } else {
        b-=BOCU1_TRAIL_BYTE_OFFSET;
    }

    /* add trail byte into difference and decrement count */
    if(count==1) {
        return b;
    } else if(count==2) {
        return b*BOCU1_TRAIL_COUNT;
    } else /* count==3 */ {
        return b*(BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT);
    }
}